

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  ImVec2 *in_RDI;
  ImGuiMenuColumns *in_stack_ffffffffffffff90;
  ImVector<float> *this_00;
  ImVec2 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  ImVec1 local_30;
  ImVec1 local_2c;
  ImVec1 local_28;
  ImVec2 local_24;
  ImVec2 local_1c [3];
  
  ImVec2::ImVec2(in_RDI);
  ImVec2::ImVec2(in_RDI + 1);
  ImVec2::ImVec2(in_RDI + 2);
  ImVec2::ImVec2(in_RDI + 3);
  ImVec2::ImVec2(in_RDI + 4);
  ImVec2::ImVec2(in_RDI + 5);
  ImVec1::ImVec1((ImVec1 *)(in_RDI + 7));
  ImVec1::ImVec1((ImVec1 *)&in_RDI[7].y);
  ImVec1::ImVec1((ImVec1 *)(in_RDI + 8));
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff90);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff90);
  ImVec2::ImVec2((ImVec2 *)&in_RDI[0x10].y);
  ImGuiMenuColumns::ImGuiMenuColumns(in_stack_ffffffffffffff90);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x17));
  ImVector<int>::ImVector((ImVector<int> *)(in_RDI + 0x1f));
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x21));
  this_00 = (ImVector<float> *)(in_RDI + 0x23);
  ImVector<float>::ImVector(this_00);
  ImVector<ImGuiGroupData>::ImVector((ImVector<ImGuiGroupData> *)(in_RDI + 0x25));
  ImVec2::ImVec2(local_1c,0.0,0.0);
  in_RDI[3] = local_1c[0];
  in_RDI[2] = in_RDI[3];
  in_RDI[1] = in_RDI[2];
  *in_RDI = in_RDI[1];
  ImVec2::ImVec2(&local_24,0.0,0.0);
  in_RDI[5] = local_24;
  in_RDI[4] = in_RDI[5];
  in_RDI[6].y = 0.0;
  in_RDI[6].x = 0.0;
  ImVec1::ImVec1(&local_28,0.0);
  in_RDI[7].x = local_28.x;
  ImVec1::ImVec1(&local_2c,0.0);
  in_RDI[7].y = local_2c.x;
  ImVec1::ImVec1(&local_30,0.0);
  in_RDI[8].x = local_30.x;
  in_RDI[8].y = 0.0;
  in_RDI[9].x = 0.0;
  ImRect::ImRect((ImRect *)this_00);
  *(undefined8 *)&in_RDI[0xb].y = local_40;
  *(undefined8 *)&in_RDI[0xc].y = uStack_38;
  *(undefined8 *)&in_RDI[9].y = *(undefined8 *)&in_RDI[0xb].y;
  *(undefined8 *)&in_RDI[10].y = *(undefined8 *)&in_RDI[0xc].y;
  in_RDI[0xf].x = 0.0;
  in_RDI[0xe].y = 0.0;
  in_RDI[0xd].y = 0.0;
  in_RDI[0xe].x = 1.4013e-45;
  in_RDI[0xf].y = 0.0;
  *(undefined1 *)&in_RDI[0x10].x = 0;
  *(undefined1 *)((long)&in_RDI[0x10].x + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x10].x + 2) = 0;
  ImVec2::ImVec2(&local_48,0.0,0.0);
  *(ImVec2 *)&in_RDI[0x10].y = local_48;
  in_RDI[0x16].x = 0.0;
  in_RDI[0x16].y = 0.0;
  in_RDI[0x19].x = 0.0;
  in_RDI[0x19].y = 0.0;
  in_RDI[0x1a].x = 0.0;
  in_RDI[0x1a].y = 0.0;
  in_RDI[0x1b].y = 1.4013e-45;
  in_RDI[0x1b].x = 1.4013e-45;
  in_RDI[0x1c].y = -NAN;
  in_RDI[0x1c].x = -NAN;
  in_RDI[0x1d].x = 0.0;
  in_RDI[0x1d].y = 0.0;
  in_RDI[0x1e].x = -1.0;
  memset(in_RDI + 0x27,0,0xc);
  return;
}

Assistant:

ImGuiWindowTempData()
    {
        CursorPos = CursorPosPrevLine = CursorStartPos = CursorMaxPos = ImVec2(0.0f, 0.0f);
        CurrLineSize = PrevLineSize = ImVec2(0.0f, 0.0f);
        CurrLineTextBaseOffset = PrevLineTextBaseOffset = 0.0f;
        Indent = ImVec1(0.0f);
        ColumnsOffset = ImVec1(0.0f);
        GroupOffset = ImVec1(0.0f);

        LastItemId = 0;
        LastItemStatusFlags = ImGuiItemStatusFlags_None;
        LastItemRect = LastItemDisplayRect = ImRect();

        NavLayerActiveMask = NavLayerActiveMaskNext = 0x00;
        NavLayerCurrent = ImGuiNavLayer_Main;
        NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
        NavFocusScopeIdCurrent = 0;
        NavHideHighlightOneFrame = false;
        NavHasScroll = false;

        MenuBarAppending = false;
        MenuBarOffset = ImVec2(0.0f, 0.0f);
        TreeDepth = 0;
        TreeJumpToParentOnPopMask = 0x00;
        StateStorage = NULL;
        CurrentColumns = NULL;
        LayoutType = ParentLayoutType = ImGuiLayoutType_Vertical;
        FocusCounterRegular = FocusCounterTabStop = -1;

        ItemFlags = ImGuiItemFlags_Default_;
        ItemWidth = 0.0f;
        TextWrapPos = -1.0f;
        memset(StackSizesBackup, 0, sizeof(StackSizesBackup));
    }